

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O1

uint Engine::getRestartLimit(uint i)

{
  Options *pOVar1;
  Options *extraout_RAX;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  double dVar6;
  
  uVar4 = (ulong)i;
  pOVar1 = &so;
  switch(so.restart_type) {
  case NONE:
    if (i < 2) {
      return 0xffffffff;
    }
    getRestartLimit();
    pOVar1 = extraout_RAX;
  case GEOMETRIC:
    uVar3 = pOVar1->restart_scale;
    dVar6 = pow(pOVar1->restart_base,(double)(uVar4 & 0xffffffff));
    uVar3 = (int)dVar6 * uVar3;
    break;
  case CONSTANT:
    uVar3 = so.restart_scale;
    break;
  case LUBY:
    do {
      bVar2 = 0;
      uVar3 = (uint)uVar4;
      if (uVar3 != 1) {
        bVar2 = 0;
        do {
          bVar2 = bVar2 + 1;
        } while (1 < uVar3 >> (bVar2 & 0x1f));
      }
      uVar5 = -1 << (bVar2 + 1 & 0x1f) ^ uVar3;
      if (uVar5 == 0xffffffff) {
        pOVar1 = (Options *)(ulong)((int)(1L << (bVar2 & 0x3f)) * so.restart_scale);
      }
      else {
        uVar4 = (ulong)(uVar3 + (-1 << (bVar2 & 0x1f)) + 1);
      }
      uVar3 = (uint)pOVar1;
    } while (uVar5 != 0xffffffff);
    break;
  default:
    uVar3 = i + 1 >> 1;
    i = (~uVar3 & uVar3 - 1) + 1;
  case LINEAR:
    uVar3 = i * so.restart_scale;
  }
  return uVar3;
}

Assistant:

unsigned int Engine::getRestartLimit(unsigned int i) {
	switch (so.restart_type) {
		case NONE:
			if (i > 1) {
				CHUFFED_ERROR("A restart occurred while using search without restarts");
			}
			return UINT_MAX;
		case CONSTANT:
			return so.restart_scale;
		case LINEAR:
			return i * so.restart_scale;
		case LUBY:
			while (true) {
				unsigned int exp = 0U;
				if (i != 1U) {
					while ((i >> (++exp)) > 1U) {
					}
				}
				if (i == (1U << (exp + 1)) - 1) {
					return static_cast<int>(1UL << exp) * so.restart_scale;
				}
				i = i - (1U << exp) + 1;
			}
		case GEOMETRIC:
			return so.restart_scale * ((int)pow(so.restart_base, i));
		default:
			i = (i + 1) / 2;
			return (((i - 1) & ~i) + 1) * so.restart_scale;
	}
	NEVER;
}